

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_callstack.c
# Opt level: O1

HT_ErrorCode ht_feature_callstack_enable(HT_Timeline *timeline)

{
  HT_ErrorCode HVar1;
  HT_Feature *feature;
  
  feature = (HT_Feature *)ht_alloc(0x48);
  if (feature == (HT_Feature *)0x0) {
    HVar1 = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    feature->klass = (HT_FeatureKlass *)HT_FeatureCallstack_get_class_feature_klass;
    HVar1 = ht_stack_init((HT_Stack *)(feature + 1),0x400,0x20);
    if (HVar1 == HT_ERR_OK) goto LAB_00107c1e;
    ht_free(feature);
  }
  feature = (HT_Feature *)0x0;
LAB_00107c1e:
  if (feature != (HT_Feature *)0x0) {
    HVar1 = ht_timeline_set_feature(timeline,feature);
    return HVar1;
  }
  return HVar1;
}

Assistant:

HT_ErrorCode
ht_feature_callstack_enable(HT_Timeline* timeline)
{
    HT_ErrorCode error_code;
    HT_Feature* feature = ht_feature_callstack_create(&error_code);

    if (!feature)
    {
        return error_code;
    }

    return ht_timeline_set_feature(timeline, feature);
}